

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olddecorations.cpp
# Opt level: O3

void ParseOldDecoration(FScanner *sc,EDefinitionType def)

{
  uint *puVar1;
  double dVar2;
  PClassActor *parent;
  BYTE *pBVar3;
  undefined1 auVar4 [16];
  uint uVar5;
  bool bVar6;
  int iVar7;
  ClassReg *pCVar8;
  PClassActor *info;
  FState *pFVar9;
  int32_t *piVar10;
  EDefinitionType EVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  char *pcVar16;
  FState *pFVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar25;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  int iVar35;
  undefined1 auVar34 [16];
  TArray<FState,_FState> StateArray;
  FExtraInfo extra;
  TArray<FScriptPosition,_FScriptPosition> SourceLines;
  FState icecopy;
  Baggage bag;
  FScriptPosition icepos;
  TArray<FState,_FState> local_168;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  double local_128;
  double dStack_120;
  TArray<FScriptPosition,_FScriptPosition> local_118;
  int local_fc;
  undefined1 local_f8 [16];
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  Baggage local_c8;
  FScriptPosition local_48;
  FName local_38;
  FName local_34;
  
  local_c8.ClassName.Chars = FString::NullString.Nothing;
  local_c8.statedef.StateLabels.Array = (FStateDefine *)0x0;
  local_c8.statedef.StateLabels.Most = 0;
  local_c8.statedef.StateLabels.Count = 0;
  local_c8.statedef.laststate = (FState *)0x0;
  local_c8.statedef.laststatebeforelabel = (FState *)0x0;
  local_c8.statedef.StateArray.Array = (FState *)0x0;
  local_c8.statedef.StateArray.Most = 0;
  local_c8.statedef.StateArray.Count = 0;
  local_c8.statedef.SourceLines.Array = (FScriptPosition *)0x0;
  local_c8.statedef.SourceLines.Most = 0;
  local_c8.statedef.SourceLines.Count = 0;
  local_c8.statedef.lastlabel = -1;
  local_c8.ScriptPosition.FileName.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 2;
  local_c8.ScriptPosition.ScriptLine = 0;
  local_168.Array = (FState *)0x0;
  local_168.Most = 0;
  local_168.Count = 0;
  local_118.Array = (FScriptPosition *)0x0;
  local_118.Most = 0;
  local_118.Count = 0;
  if (def == DEF_Pickup) {
    pCVar8 = &AFakeInventory::RegistrationInfo;
  }
  else {
    pCVar8 = &AActor::RegistrationInfo;
  }
  parent = (PClassActor *)pCVar8->MyClass;
  FScanner::MustGetString(sc);
  iVar7 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
  FScriptPosition::FScriptPosition((FScriptPosition *)local_f8,sc);
  local_fc = iVar7;
  local_34.Index = iVar7;
  info = DecoDerivedClass((FScriptPosition *)local_f8,parent,&local_34);
  FString::~FString((FString *)local_f8);
  local_c8.DropItemList = (DDropItem *)0x0;
  local_c8.DropItemSet = false;
  local_c8.CurrentState = 0;
  local_c8.StateSet = false;
  local_c8.fromDecorate = true;
  FStateDefinitions::MakeStateDefines(&local_c8.statedef,parent);
  local_c8.fromDecorate = true;
  local_c8.Info = info;
  FString::operator=(&local_c8.ClassName,
                     FName::NameData.NameArray
                     [(info->super_PClass).super_PNativeStruct.super_PStruct.super_PNamedType.
                      TypeName.Index].Text);
  info->GameFilter = '\0';
  FScanner::MustGetStringName(sc,"{");
  local_128 = 0.0;
  dStack_120 = 0.0;
  local_138 = 0;
  uStack_130 = 0;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  pBVar3 = (info->super_PClass).Defaults;
  local_f8._4_4_ = local_f8._4_4_ & 0xffffff00;
  local_f8._0_4_ = 0x31544e54;
  FScanner::MustGetString(sc);
  bVar6 = FScanner::Compare(sc,"}");
  if (!bVar6) {
    EVar11 = def | DEF_Pickup;
    do {
      bVar6 = FScanner::Compare(sc,"DoomEdNum");
      if (bVar6) {
        FScanner::MustGetNumber(sc);
        iVar7 = sc->Number;
        if (iVar7 - 0x8000U < 0xffff7fff) {
          FScanner::ScriptError(sc,"DoomEdNum must be in the range [-1,32767]");
          iVar7 = sc->Number;
        }
        (local_c8.Info)->DoomEdNum = (SWORD)iVar7;
      }
      else {
        bVar6 = FScanner::Compare(sc,"SpawnNum");
        if (bVar6) {
          FScanner::MustGetNumber(sc);
          uVar12 = sc->Number;
          if (0xff < uVar12) {
            FScanner::ScriptError(sc,"SpawnNum must be in the range [0,255]");
            uVar12 = sc->Number;
          }
          (local_c8.Info)->SpawnID = (ushort)uVar12 & 0xff;
        }
        else {
          bVar6 = FScanner::Compare(sc,"Sprite");
          if (!bVar6) {
            if ((EVar11 != DEF_Projectile) || (bVar6 = FScanner::Compare(sc,"DeathSprite"), !bVar6))
            {
              bVar6 = FScanner::Compare(sc,"Frames");
              if (bVar6) {
                FScanner::MustGetString(sc);
                uStack_150 = CONCAT44(uStack_150._4_4_,local_168.Count);
                ParseSpriteFrames(local_c8.Info,&local_168,&local_118,sc);
                uStack_150 = CONCAT44(local_168.Count,(uint)uStack_150);
              }
              else if (EVar11 == DEF_Projectile) {
                bVar6 = FScanner::Compare(sc,"DeathFrames");
                if (bVar6) {
                  FScanner::MustGetString(sc);
                  local_148 = CONCAT44(local_148._4_4_,local_168.Count);
                  ParseSpriteFrames(local_c8.Info,&local_168,&local_118,sc);
                  local_148 = CONCAT44(local_168.Count,(uint)local_148);
                }
                else {
                  if (def != DEF_BreakableDecoration) goto LAB_0053c80d;
                  bVar6 = FScanner::Compare(sc,"IceDeathFrames");
                  if (bVar6) {
                    FScanner::MustGetString(sc);
                    uStack_140 = CONCAT44(uStack_140._4_4_,local_168.Count);
                    ParseSpriteFrames(local_c8.Info,&local_168,&local_118,sc);
                    uStack_140 = CONCAT44(local_168.Count,(uint)uStack_140);
                  }
                  else {
                    bVar6 = FScanner::Compare(sc,"BurnDeathFrames");
                    if (bVar6) {
                      FScanner::MustGetString(sc);
                      local_138 = CONCAT44(local_138._4_4_,local_168.Count);
                      ParseSpriteFrames(local_c8.Info,&local_168,&local_118,sc);
                      local_138 = CONCAT44(local_168.Count,(uint)local_138);
                    }
                    else {
                      bVar6 = FScanner::Compare(sc,"GenericIceDeath");
                      if (bVar6) {
                        uStack_130._0_5_ = CONCAT14(1,(undefined4)uStack_130);
                      }
                      else {
                        bVar6 = FScanner::Compare(sc,"BurnsAway");
                        if (bVar6) {
                          uStack_130._0_3_ = CONCAT12(1,(undefined2)uStack_130);
                        }
                        else {
                          bVar6 = FScanner::Compare(sc,"DiesAway");
                          if (!bVar6) goto LAB_0053c80d;
                          uStack_130._0_4_ = CONCAT13(1,(undefined3)uStack_130);
                        }
                      }
                    }
                  }
                }
              }
              else {
LAB_0053c80d:
                bVar6 = FScanner::Compare(sc,"Alpha");
                if (bVar6) {
                  FScanner::MustGetFloat(sc);
                  dVar2 = sc->Float;
                  dVar26 = 1.0;
                  if (dVar2 <= 1.0) {
                    dVar26 = dVar2;
                  }
                  *(ulong *)(pBVar3 + 0x118) = -(ulong)(0.0 < dVar2) & (ulong)dVar26;
                }
                else {
                  bVar6 = FScanner::Compare(sc,"Scale");
                  if (bVar6) {
                    FScanner::MustGetFloat(sc);
                    dVar2 = sc->Float;
                    *(double *)(pBVar3 + 0x100) = dVar2;
                    *(double *)(pBVar3 + 0xf8) = dVar2;
                  }
                  else {
                    bVar6 = FScanner::Compare(sc,"RenderStyle");
                    if (bVar6) {
                      FScanner::MustGetString(sc);
                      iVar7 = FScanner::MustMatchString(sc,RenderStyles,8);
                      *(FRenderStyle *)(pBVar3 + 0x108) = LegacyRenderStyles[iVar7];
                    }
                    else {
                      bVar6 = FScanner::Compare(sc,"Radius");
                      if (bVar6) {
                        FScanner::MustGetFloat(sc);
                        *(double *)(pBVar3 + 0x178) = sc->Float;
                      }
                      else {
                        bVar6 = FScanner::Compare(sc,"Height");
                        if (bVar6) {
                          FScanner::MustGetFloat(sc);
                          *(double *)(pBVar3 + 0x180) = sc->Float;
                        }
                        else if (def == DEF_BreakableDecoration) {
                          bVar6 = FScanner::Compare(sc,"DeathHeight");
                          if (bVar6) {
                            FScanner::MustGetFloat(sc);
                            local_128 = sc->Float;
                          }
                          else {
                            bVar6 = FScanner::Compare(sc,"BurnHeight");
                            if (bVar6) {
                              FScanner::MustGetFloat(sc);
                              dStack_120 = sc->Float;
                            }
                            else {
                              bVar6 = FScanner::Compare(sc,"Health");
                              if (!bVar6) goto LAB_0053cb24;
                              FScanner::MustGetNumber(sc);
                              *(int *)(pBVar3 + 0x1fc) = sc->Number;
                            }
                          }
                        }
                        else if (def == DEF_Projectile) {
                          bVar6 = FScanner::Compare(sc,"ExplosionRadius");
                          if (bVar6) {
                            FScanner::MustGetNumber(sc);
                            (local_c8.Info)->ExplosionRadius = sc->Number;
                          }
                          else {
                            bVar6 = FScanner::Compare(sc,"ExplosionDamage");
                            if (!bVar6) {
                              bVar6 = FScanner::Compare(sc,"DoNotHurtShooter");
                              if (bVar6) {
                                (local_c8.Info)->DontHurtShooter = true;
                              }
                              else {
                                bVar6 = FScanner::Compare(sc,"Damage");
                                if (bVar6) {
                                  FScanner::MustGetNumber(sc);
                                  *(int *)(pBVar3 + 0x1a8) = sc->Number;
                                  pBVar3[0x1b0] = '\0';
                                  pBVar3[0x1b1] = '\0';
                                  pBVar3[0x1b2] = '\0';
                                  pBVar3[0x1b3] = '\0';
                                  pBVar3[0x1b4] = '\0';
                                  pBVar3[0x1b5] = '\0';
                                  pBVar3[0x1b6] = '\0';
                                  pBVar3[0x1b7] = '\0';
                                }
                                else {
                                  bVar6 = FScanner::Compare(sc,"DamageType");
                                  if (bVar6) {
                                    FScanner::MustGetString(sc);
                                    bVar6 = FScanner::Compare(sc,"Normal");
                                    if (bVar6) {
                                      pBVar3[0x404] = '\0';
                                      pBVar3[0x405] = '\0';
                                      pBVar3[0x406] = '\0';
                                      pBVar3[0x407] = '\0';
                                    }
                                    else {
                                      iVar7 = FName::NameManager::FindName
                                                        (&FName::NameData,sc->String,false);
                                      *(int *)(pBVar3 + 0x404) = iVar7;
                                    }
                                  }
                                  else {
                                    bVar6 = FScanner::Compare(sc,"Speed");
                                    if (!bVar6) goto LAB_0053cb24;
                                    FScanner::MustGetFloat(sc);
                                    *(double *)(pBVar3 + 0xe0) = sc->Float;
                                  }
                                }
                              }
                              goto LAB_0053c6a7;
                            }
                            FScanner::MustGetNumber(sc);
                            (local_c8.Info)->ExplosionDamage = sc->Number;
                          }
                          uStack_130._0_6_ = CONCAT15(1,(undefined5)uStack_130);
                        }
                        else {
LAB_0053cb24:
                          bVar6 = FScanner::Compare(sc,"Mass");
                          if (bVar6) {
                            FScanner::MustGetFloat(sc);
                            *(int *)(pBVar3 + 0x3f8) = (int)sc->Float;
                          }
                          else {
                            bVar6 = FScanner::Compare(sc,"Translation1");
                            if (bVar6) {
                              FScanner::MustGetNumber(sc);
                              uVar12 = sc->Number;
                              if (2 < uVar12) {
                                FScanner::ScriptError(sc,"Translation1 must be in the range [0,2]");
                                uVar12 = sc->Number;
                              }
                              uVar12 = uVar12 | 0x30000;
                            }
                            else {
                              bVar6 = FScanner::Compare(sc,"Translation2");
                              if (!bVar6) {
                                if (EVar11 == DEF_Projectile) {
                                  bVar6 = FScanner::Compare(sc,"DeathSound");
                                  if (bVar6) {
                                    FScanner::MustGetString(sc);
                                    iVar7 = S_FindSound(sc->String);
                                    *(int *)(pBVar3 + 0x3d0) = iVar7;
                                  }
                                  else {
                                    if (def != DEF_BreakableDecoration) goto LAB_0053cc5e;
                                    bVar6 = FScanner::Compare(sc,"BurnDeathSound");
                                    if (bVar6) {
                                      FScanner::MustGetString(sc);
                                      iVar7 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 0x3d4) = iVar7;
                                    }
                                    else {
                                      bVar6 = FScanner::Compare(sc,"SolidOnDeath");
                                      if (bVar6) {
                                        uStack_130 = CONCAT71(uStack_130._1_7_,1);
                                      }
                                      else {
                                        bVar6 = FScanner::Compare(sc,"SolidOnBurn");
                                        if (!bVar6) goto LAB_0053ce04;
                                        uStack_130._0_2_ = CONCAT11(1,(char)uStack_130);
                                      }
                                    }
                                  }
                                }
                                else {
LAB_0053cc5e:
                                  if (def == DEF_Projectile) {
                                    bVar6 = FScanner::Compare(sc,"SpawnSound");
                                    if (bVar6) {
                                      FScanner::MustGetString(sc);
                                      iVar7 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 0x3c4) = iVar7;
                                    }
                                    else {
                                      bVar6 = FScanner::Compare(sc,"DoomBounce");
                                      if (bVar6) {
                                        pBVar3[0x2d8] = 0xaf;
                                        pBVar3[0x2d9] = '\0';
                                      }
                                      else {
                                        bVar6 = FScanner::Compare(sc,"HereticBounce");
                                        if (bVar6) {
                                          pBVar3[0x2d8] = 0xc6;
                                          pBVar3[0x2d9] = '\0';
                                        }
                                        else {
                                          bVar6 = FScanner::Compare(sc,"HexenBounce");
                                          if (!bVar6) goto LAB_0053ce04;
                                          pBVar3[0x2d8] = 0x8f;
                                          pBVar3[0x2d9] = '\0';
                                        }
                                      }
                                    }
                                  }
                                  else if (def == DEF_Pickup) {
                                    bVar6 = FScanner::Compare(sc,"PickupSound");
                                    if (bVar6) {
                                      FScanner::MustGetString(sc);
                                      iVar7 = S_FindSound(sc->String);
                                      *(int *)(pBVar3 + 0x4f8) = iVar7;
                                    }
                                    else {
                                      bVar6 = FScanner::Compare(sc,"PickupMessage");
                                      if (bVar6) {
                                        FScanner::MustGetString(sc);
                                        FString::operator=((FString *)(local_c8.Info + 1),sc->String
                                                          );
                                      }
                                      else {
                                        bVar6 = FScanner::Compare(sc,"Respawns");
                                        if (!bVar6) goto LAB_0053ce04;
                                        pBVar3[0x4fc] = '\x01';
                                      }
                                    }
                                  }
                                  else {
LAB_0053ce04:
                                    if (*sc->String == '*') {
                                      FScanner::ScriptError(sc,(char *)0x0);
                                    }
                                    else {
                                      HandleActorFlag(sc,&local_c8,sc->String,(char *)0x0,0x2b);
                                    }
                                  }
                                }
                                goto LAB_0053c6a7;
                              }
                              FScanner::MustGetNumber(sc);
                              uVar12 = sc->Number;
                              if (0xfffe < uVar12) {
                                FScanner::ScriptError
                                          (sc,
                                           "Translation2 must be in the range [0,MAX_ACS_TRANSLATIONS]"
                                          );
                                uVar12 = sc->Number;
                              }
                              uVar12 = uVar12 | 0x40000;
                            }
                            *(uint *)(pBVar3 + 0x3c0) = uVar12;
                          }
                        }
                      }
                    }
                  }
                }
              }
              goto LAB_0053c6a7;
            }
            local_158 = CONCAT71(local_158._1_7_,1);
          }
          FScanner::MustGetString(sc);
          if (sc->StringLen != 4) {
            FScanner::ScriptError(sc,"Sprite name must be exactly four characters long");
          }
          if ((char)local_158 == '\x01') {
            local_158 = CONCAT44(local_158._4_4_,*(undefined4 *)sc->String);
          }
          else {
            local_f8._0_4_ = *(undefined4 *)sc->String;
          }
        }
      }
LAB_0053c6a7:
      FScanner::MustGetString(sc);
      bVar6 = FScanner::Compare(sc,"}");
    } while (!bVar6);
  }
  iVar7 = GetSpriteIndex(local_f8,true);
  auVar4 = _DAT_005d6240;
  uVar15 = (ulong)local_168._8_8_ >> 0x20;
  if (uVar15 != 0) {
    lVar13 = uVar15 - 1;
    auVar20._8_4_ = (int)lVar13;
    auVar20._0_8_ = lVar13;
    auVar20._12_4_ = (int)((ulong)lVar13 >> 0x20);
    lVar13 = 0;
    auVar20 = auVar20 ^ _DAT_005d6240;
    auVar27 = _DAT_005d6f70;
    auVar29 = _DAT_005d6230;
    do {
      auVar34 = auVar29 ^ auVar4;
      iVar25 = auVar20._4_4_;
      if ((bool)(~(auVar34._4_4_ == iVar25 && auVar20._0_4_ < auVar34._0_4_ ||
                  iVar25 < auVar34._4_4_) & 1)) {
        *(int *)((long)&(local_168.Array)->sprite + lVar13) = iVar7;
      }
      if ((auVar34._12_4_ != auVar20._12_4_ || auVar34._8_4_ <= auVar20._8_4_) &&
          auVar34._12_4_ <= auVar20._12_4_) {
        *(int *)((long)&local_168.Array[1].sprite + lVar13) = iVar7;
      }
      auVar34 = auVar27 ^ auVar4;
      iVar35 = auVar34._4_4_;
      if (iVar35 <= iVar25 && (iVar35 != iVar25 || auVar34._0_4_ <= auVar20._0_4_)) {
        *(int *)((long)&local_168.Array[2].sprite + lVar13) = iVar7;
        *(int *)((long)&local_168.Array[3].sprite + lVar13) = iVar7;
      }
      lVar14 = auVar29._8_8_;
      auVar29._0_8_ = auVar29._0_8_ + 4;
      auVar29._8_8_ = lVar14 + 4;
      lVar14 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar14 + 4;
      lVar13 = lVar13 + 0xa0;
    } while ((uVar15 * 8 + 0x18 & 0xffffffffffffffe0) * 5 != lVar13);
  }
  if (((char)local_158 != '\0') && (local_148._4_4_ != 0)) {
    iVar7 = GetSpriteIndex((char *)&local_158,true);
    auVar29 = _DAT_005d6f70;
    auVar27 = _DAT_005d6240;
    auVar4 = _DAT_005d6230;
    if ((uint)local_148 < local_148._4_4_) {
      lVar13 = (ulong)local_148._4_4_ - (local_148 & 0xffffffff);
      lVar14 = lVar13 + -1;
      auVar34._8_4_ = (int)lVar14;
      auVar34._0_8_ = lVar14;
      auVar34._12_4_ = (int)((ulong)lVar14 >> 0x20);
      piVar10 = &local_168.Array[(local_148 & 0xffffffff) + 3].sprite;
      uVar15 = 0;
      auVar34 = auVar34 ^ _DAT_005d6240;
      do {
        auVar33._8_4_ = (int)uVar15;
        auVar33._0_8_ = uVar15;
        auVar33._12_4_ = (int)(uVar15 >> 0x20);
        auVar20 = (auVar33 | auVar4) ^ auVar27;
        iVar25 = auVar34._4_4_;
        if ((bool)(~(auVar20._4_4_ == iVar25 && auVar34._0_4_ < auVar20._0_4_ ||
                    iVar25 < auVar20._4_4_) & 1)) {
          piVar10[-0x1e] = iVar7;
        }
        if ((auVar20._12_4_ != auVar34._12_4_ || auVar20._8_4_ <= auVar34._8_4_) &&
            auVar20._12_4_ <= auVar34._12_4_) {
          piVar10[-0x14] = iVar7;
        }
        auVar20 = (auVar33 | auVar29) ^ auVar27;
        iVar35 = auVar20._4_4_;
        if (iVar35 <= iVar25 && (iVar35 != iVar25 || auVar20._0_4_ <= auVar34._0_4_)) {
          piVar10[-10] = iVar7;
          *piVar10 = iVar7;
        }
        uVar15 = uVar15 + 4;
        piVar10 = piVar10 + 0x28;
      } while ((lVar13 + 3U & 0xfffffffffffffffc) != uVar15);
    }
  }
  (local_c8.Info)->NumOwnedStates = local_168.Count;
  if (local_168.Count == 0) {
    pcVar16 = "%s does not define any animation frames";
LAB_0053ce4b:
    FScanner::ScriptError(sc,pcVar16,FName::NameData.NameArray[local_fc].Text);
  }
  else {
    if (uStack_150._4_4_ == 0) {
      pcVar16 = "%s does not have a Frames definition";
      goto LAB_0053ce4b;
    }
    if ((def == DEF_BreakableDecoration) && (local_148._4_4_ == 0)) {
      pcVar16 = "%s does not have a DeathFrames definition";
      goto LAB_0053ce4b;
    }
    if ((uStack_140._4_4_ != 0) && (uStack_130._4_1_ == '\x01')) {
      FScanner::ScriptError(sc,"You cannot use IceDeathFrames and GenericIceDeath together");
    }
  }
  if (uStack_140._4_4_ != 0) {
    uVar12 = uStack_140._4_4_ - 1;
    local_f8._0_8_ = local_168.Array[uVar12].NextState;
    local_f8._8_8_ = local_168.Array[uVar12].ActionFunc;
    pFVar9 = local_168.Array + uVar12;
    local_e8._0_4_ = pFVar9->sprite;
    local_e8._4_2_ = pFVar9->Tics;
    local_e8._6_2_ = pFVar9->TicRange;
    uStack_e0 = *(undefined8 *)(&pFVar9->sprite + 2);
    local_d8._0_4_ = local_168.Array[uVar12].Misc1;
    local_d8._4_4_ = local_168.Array[uVar12].Misc2;
    FScriptPosition::FScriptPosition(&local_48,local_118.Array + uVar12);
    TArray<FState,_FState>::Grow(&local_168,1);
    uVar15 = (ulong)local_168.Count;
    local_168.Array[uVar15].Misc1 = (undefined4)local_d8;
    local_168.Array[uVar15].Misc2 = local_d8._4_4_;
    pFVar9 = local_168.Array + uVar15;
    pFVar9->sprite = (undefined4)local_e8;
    pFVar9->Tics = local_e8._4_2_;
    pFVar9->TicRange = local_e8._6_2_;
    *(undefined8 *)(&pFVar9->sprite + 2) = uStack_e0;
    local_168.Array[uVar15].NextState = (FState *)local_f8._0_8_;
    local_168.Array[uVar15].ActionFunc = (VMFunction *)local_f8._8_8_;
    local_168.Count = local_168.Count + 1;
    TArray<FScriptPosition,_FScriptPosition>::Grow(&local_118,1);
    FScriptPosition::FScriptPosition(local_118.Array + ((ulong)local_118._8_8_ >> 0x20),&local_48);
    local_118.Count = local_118.Count + 1;
    info->NumOwnedStates = info->NumOwnedStates + 1;
    FString::~FString(&local_48.FileName);
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)info->NumOwnedStates;
  uVar15 = 0xffffffffffffffff;
  if (SUB168(auVar4 * ZEXT816(0x28),8) == 0) {
    uVar15 = SUB168(auVar4 * ZEXT816(0x28),0);
  }
  pFVar9 = (FState *)operator_new__(uVar15);
  info->OwnedStates = pFVar9;
  SaveStateSourceLines(pFVar9,&local_118);
  memcpy(info->OwnedStates,local_168.Array,(long)info->NumOwnedStates * 0x28);
  auVar27 = _DAT_005d6240;
  auVar4 = _DAT_005d6230;
  if (info->NumOwnedStates == 1) {
    pFVar9 = info->OwnedStates;
    pFVar9->Tics = -1;
    pFVar9->TicRange = 0;
    pFVar9->Misc1 = 0;
  }
  else {
    uVar18 = uStack_150 & 0xffffffff;
    uVar12 = uStack_150._4_4_ - 1;
    pFVar9 = info->OwnedStates;
    uVar15 = uVar18;
    if ((uint)uStack_150 < uVar12) {
      lVar13 = uVar12 - uVar18;
      lVar14 = lVar13 + -1;
      auVar21._8_4_ = (int)lVar14;
      auVar21._0_8_ = lVar14;
      auVar21._12_4_ = (int)((ulong)lVar14 >> 0x20);
      pFVar17 = pFVar9 + uVar18 + 1;
      uVar19 = 0;
      auVar21 = auVar21 ^ _DAT_005d6240;
      do {
        auVar28._8_4_ = (int)uVar19;
        auVar28._0_8_ = uVar19;
        auVar28._12_4_ = (int)(uVar19 >> 0x20);
        auVar29 = (auVar28 | auVar4) ^ auVar27;
        if ((bool)(~(auVar29._4_4_ == auVar21._4_4_ && auVar21._0_4_ < auVar29._0_4_ ||
                    auVar21._4_4_ < auVar29._4_4_) & 1)) {
          pFVar17[-1].NextState = pFVar17;
        }
        if ((auVar29._12_4_ != auVar21._12_4_ || auVar29._8_4_ <= auVar21._8_4_) &&
            auVar29._12_4_ <= auVar21._12_4_) {
          pFVar17->NextState = pFVar17 + 1;
        }
        uVar19 = uVar19 + 2;
        pFVar17 = pFVar17 + 2;
        uVar15 = (ulong)uVar12;
      } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar19);
    }
    pFVar9[uVar15].NextState = pFVar9 + uVar18;
    auVar27 = _DAT_005d6240;
    auVar4 = _DAT_005d6230;
    if (local_148._4_4_ != 0) {
      uVar18 = local_148 & 0xffffffff;
      uVar12 = local_148._4_4_ - 1;
      uVar15 = uVar18;
      if ((uint)local_148 < uVar12) {
        lVar13 = uVar12 - uVar18;
        lVar14 = lVar13 + -1;
        auVar22._8_4_ = (int)lVar14;
        auVar22._0_8_ = lVar14;
        auVar22._12_4_ = (int)((ulong)lVar14 >> 0x20);
        pFVar17 = pFVar9 + uVar18 + 1;
        uVar19 = 0;
        auVar22 = auVar22 ^ _DAT_005d6240;
        do {
          auVar30._8_4_ = (int)uVar19;
          auVar30._0_8_ = uVar19;
          auVar30._12_4_ = (int)(uVar19 >> 0x20);
          auVar29 = (auVar30 | auVar4) ^ auVar27;
          if ((bool)(~(auVar29._4_4_ == auVar22._4_4_ && auVar22._0_4_ < auVar29._0_4_ ||
                      auVar22._4_4_ < auVar29._4_4_) & 1)) {
            pFVar17[-1].NextState = pFVar17;
          }
          if ((auVar29._12_4_ != auVar22._12_4_ || auVar29._8_4_ <= auVar22._8_4_) &&
              auVar29._12_4_ <= auVar22._12_4_) {
            pFVar17->NextState = pFVar17 + 1;
          }
          uVar19 = uVar19 + 2;
          pFVar17 = pFVar17 + 2;
          uVar15 = (ulong)uVar12;
        } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar19);
      }
      if ((def == DEF_Projectile) || (uStack_130._3_1_ != '\0')) {
        pFVar9[uVar15].NextState = (FState *)0x0;
        if (def != DEF_Projectile) goto LAB_0053d1e8;
        if (uStack_130._5_1_ == '\x01') {
          FState::SetAction(pFVar9 + uVar18,"A_Explode");
        }
      }
      else {
        pFVar9[uVar15].Tics = -1;
        pFVar9[uVar15].TicRange = 0;
        pFVar9[uVar15].Misc1 = 0;
LAB_0053d1e8:
        FState::SetAction(pFVar9 + uVar18,"A_Scream");
        if ((char)uStack_130 == '\0') {
          uVar12 = (uint)local_148 + 1;
          uVar5 = (uint)local_148;
          if (uVar12 < local_148._4_4_) {
            uVar5 = uVar12;
          }
          pcVar16 = "A_ScreamAndUnblock";
          if (uVar12 < local_148._4_4_) {
            pcVar16 = "A_NoBlocking";
          }
          FState::SetAction(info->OwnedStates + uVar5,pcVar16);
        }
        if ((local_128 == 0.0) && (!NAN(local_128))) {
          local_128 = *(double *)((info->super_PClass).Defaults + 0x180);
        }
        info->DeathHeight = local_128;
      }
      FStateDefinitions::SetStateLabel
                (&local_c8.statedef,"Death",info->OwnedStates + (local_148 & 0xffffffff),'\x01');
    }
    auVar27 = _DAT_005d6240;
    auVar4 = _DAT_005d6230;
    if (local_138._4_4_ != 0) {
      uVar18 = local_138 & 0xffffffff;
      uVar12 = local_138._4_4_ - 1;
      uVar15 = uVar18;
      if ((uint)local_138 < uVar12) {
        lVar13 = uVar12 - uVar18;
        lVar14 = lVar13 + -1;
        auVar23._8_4_ = (int)lVar14;
        auVar23._0_8_ = lVar14;
        auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
        pFVar9 = info->OwnedStates + uVar18 + 1;
        uVar19 = 0;
        auVar23 = auVar23 ^ _DAT_005d6240;
        do {
          auVar31._8_4_ = (int)uVar19;
          auVar31._0_8_ = uVar19;
          auVar31._12_4_ = (int)(uVar19 >> 0x20);
          auVar29 = (auVar31 | auVar4) ^ auVar27;
          if ((bool)(~(auVar29._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar29._0_4_ ||
                      auVar23._4_4_ < auVar29._4_4_) & 1)) {
            pFVar9[-1].NextState = pFVar9;
          }
          if ((auVar29._12_4_ != auVar23._12_4_ || auVar29._8_4_ <= auVar23._8_4_) &&
              auVar29._12_4_ <= auVar23._12_4_) {
            pFVar9->NextState = pFVar9 + 1;
          }
          uVar19 = uVar19 + 2;
          pFVar9 = pFVar9 + 2;
          uVar15 = (ulong)uVar12;
        } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar19);
      }
      pFVar9 = info->OwnedStates;
      if (uStack_130._2_1_ == '\x01') {
        pFVar9[uVar15].NextState = (FState *)0x0;
      }
      else {
        pFVar9[uVar15].Tics = -1;
        pFVar9[uVar15].TicRange = 0;
        pFVar9[uVar15].Misc1 = 0;
      }
      FState::SetAction(pFVar9 + uVar18,"A_ActiveSound");
      if (uStack_130._1_1_ == '\0') {
        uVar12 = (uint)local_138 + 1;
        uVar5 = (uint)local_138;
        if (uVar12 < local_138._4_4_) {
          uVar5 = uVar12;
        }
        pcVar16 = "A_ActiveAndUnblock";
        if (uVar12 < local_138._4_4_) {
          pcVar16 = "A_NoBlocking";
        }
        FState::SetAction(info->OwnedStates + uVar5,pcVar16);
      }
      if ((dStack_120 == 0.0) && (!NAN(dStack_120))) {
        dStack_120 = *(double *)((info->super_PClass).Defaults + 0x180);
      }
      info->BurnHeight = dStack_120;
      FStateDefinitions::SetStateLabel
                (&local_c8.statedef,"Burn",info->OwnedStates + (local_138 & 0xffffffff),'\x01');
    }
    auVar27 = _DAT_005d6240;
    auVar4 = _DAT_005d6230;
    if (uStack_140._4_4_ == 0) {
      if (uStack_130._4_1_ != '\x01') goto LAB_0053d5d2;
      local_38.Index = 0x95;
      pFVar9 = PClassActor::FindState
                         ((PClassActor *)AActor::RegistrationInfo.MyClass,1,&local_38,false);
    }
    else {
      uVar15 = uStack_140 & 0xffffffff;
      uVar12 = uStack_140._4_4_ - 1;
      pFVar9 = info->OwnedStates;
      if ((uint)uStack_140 < uVar12) {
        lVar13 = uVar12 - uVar15;
        lVar14 = lVar13 + -1;
        auVar24._8_4_ = (int)lVar14;
        auVar24._0_8_ = lVar14;
        auVar24._12_4_ = (int)((ulong)lVar14 >> 0x20);
        pFVar17 = pFVar9 + uVar15 + 1;
        uVar18 = 0;
        auVar24 = auVar24 ^ _DAT_005d6240;
        do {
          auVar32._8_4_ = (int)uVar18;
          auVar32._0_8_ = uVar18;
          auVar32._12_4_ = (int)(uVar18 >> 0x20);
          auVar29 = (auVar32 | auVar4) ^ auVar27;
          if ((bool)(~(auVar29._4_4_ == auVar24._4_4_ && auVar24._0_4_ < auVar29._0_4_ ||
                      auVar24._4_4_ < auVar29._4_4_) & 1)) {
            pFVar17[-1].NextState = pFVar17;
          }
          if ((auVar29._12_4_ != auVar24._12_4_ || auVar29._8_4_ <= auVar24._8_4_) &&
              auVar29._12_4_ <= auVar24._12_4_) {
            pFVar17->NextState = pFVar17 + 1;
          }
          uVar18 = uVar18 + 2;
          pFVar17 = pFVar17 + 2;
          uVar15 = (ulong)uVar12;
        } while ((lVar13 + 1U & 0xfffffffffffffffe) != uVar18);
      }
      pFVar17 = pFVar9 + uVar15;
      pFVar17->NextState = pFVar9 + (long)info->NumOwnedStates + -1;
      pFVar17->Tics = 5;
      pFVar17->TicRange = 0;
      pFVar17->Misc1 = 0;
      FState::SetAction(pFVar17,"A_FreezeDeath");
      iVar7 = info->NumOwnedStates;
      pFVar9 = info->OwnedStates;
      pFVar17 = pFVar9 + (long)iVar7 + -1;
      pFVar17->NextState = pFVar17;
      pFVar9[(long)iVar7 + -1].Tics = 1;
      pFVar9[(long)iVar7 + -1].TicRange = 0;
      pFVar9[(long)iVar7 + -1].Misc1 = 0;
      FState::SetAction(pFVar17,"A_FreezeDeathChunks");
      pFVar9 = info->OwnedStates + (uStack_140 & 0xffffffff);
    }
    FStateDefinitions::SetStateLabel(&local_c8.statedef,"Ice",pFVar9,'\x01');
  }
LAB_0053d5d2:
  if (def == DEF_BreakableDecoration) {
    uVar12 = 4;
  }
  else {
    if (def != DEF_Projectile) goto LAB_0053d5f5;
    uVar12 = 0x10400;
  }
  puVar1 = (uint *)((info->super_PClass).Defaults + 0x1bc);
  *puVar1 = *puVar1 | uVar12;
LAB_0053d5f5:
  FStateDefinitions::SetStateLabel
            (&local_c8.statedef,"Spawn",info->OwnedStates + (uStack_150 & 0xffffffff),'\x01');
  FStateDefinitions::InstallStates(&local_c8.statedef,info,(AActor *)(info->super_PClass).Defaults);
  TArray<FScriptPosition,_FScriptPosition>::~TArray(&local_118);
  TArray<FState,_FState>::~TArray(&local_168);
  FString::~FString(&local_c8.ScriptPosition.FileName);
  TArray<FScriptPosition,_FScriptPosition>::~TArray(&local_c8.statedef.SourceLines);
  TArray<FState,_FState>::~TArray(&local_c8.statedef.StateArray);
  TArray<FStateDefine,_FStateDefine>::~TArray(&local_c8.statedef.StateLabels);
  FString::~FString(&local_c8.ClassName);
  return;
}

Assistant:

void ParseOldDecoration(FScanner &sc, EDefinitionType def)
{
	Baggage bag;
	TArray<FState> StateArray;
	TArray<FScriptPosition> SourceLines;
	FExtraInfo extra;
	PClassActor *type;
	PClassActor *parent;
	FName typeName;

	parent = (def == DEF_Pickup) ? RUNTIME_CLASS(AFakeInventory) : RUNTIME_CLASS(AActor);

	sc.MustGetString();
	typeName = FName(sc.String);
	type = DecoDerivedClass(FScriptPosition(sc), parent, typeName);
	ResetBaggage(&bag, parent);
	bag.Info = type;
	bag.fromDecorate = true;
#ifdef _DEBUG
	bag.ClassName = type->TypeName;
#endif

	type->GameFilter = GAME_Any;
	sc.MustGetStringName("{");

	memset (&extra, 0, sizeof(extra));
	ParseInsideDecoration (bag, (AActor *)(type->Defaults), extra, def, sc, StateArray, SourceLines);

	bag.Info->NumOwnedStates = StateArray.Size();
	if (bag.Info->NumOwnedStates == 0)
	{
		sc.ScriptError ("%s does not define any animation frames", typeName.GetChars() );
	}
	else if (extra.SpawnEnd == 0)
	{
		sc.ScriptError ("%s does not have a Frames definition", typeName.GetChars() );
	}
	else if (def == DEF_BreakableDecoration && extra.DeathEnd == 0)
	{
		sc.ScriptError ("%s does not have a DeathFrames definition", typeName.GetChars() );
	}
	else if (extra.IceDeathEnd != 0 && extra.bGenericIceDeath)
	{
		sc.ScriptError ("You cannot use IceDeathFrames and GenericIceDeath together");
	}

	if (extra.IceDeathEnd != 0)
	{
		// Make a copy of the final frozen frame for A_FreezeDeathChunks
		FState icecopy = StateArray[extra.IceDeathEnd-1];
		FScriptPosition icepos = SourceLines[extra.IceDeathEnd - 1];
		StateArray.Push (icecopy);
		SourceLines.Push(icepos);
		type->NumOwnedStates += 1;
	}

	type->OwnedStates = new FState[type->NumOwnedStates];
	SaveStateSourceLines(type->OwnedStates, SourceLines);
	memcpy (type->OwnedStates, &StateArray[0], type->NumOwnedStates * sizeof(type->OwnedStates[0]));
	if (type->NumOwnedStates == 1)
	{
		type->OwnedStates->Tics = -1;
		type->OwnedStates->TicRange = 0;
		type->OwnedStates->Misc1 = 0;
	}
	else
	{
		size_t i;

		// Spawn states loop endlessly
		for (i = extra.SpawnStart; i < extra.SpawnEnd-1; ++i)
		{
			type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
		}
		type->OwnedStates[i].NextState = &type->OwnedStates[extra.SpawnStart];

		// Death states are one-shot and freeze on the final state
		if (extra.DeathEnd != 0)
		{
			for (i = extra.DeathStart; i < extra.DeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bDiesAway || def == DEF_Projectile)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			if (def == DEF_Projectile)
			{
				if (extra.bExplosive)
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_Explode");
				}
			}
			else
			{
				// The first frame plays the death sound and
				// the second frame makes it nonsolid.
				type->OwnedStates[extra.DeathStart].SetAction("A_Scream");
				if (extra.bSolidOnDeath)
				{
				}
				else if (extra.DeathStart + 1 < extra.DeathEnd)
				{
					type->OwnedStates[extra.DeathStart+1].SetAction("A_NoBlocking");
				}
				else
				{
					type->OwnedStates[extra.DeathStart].SetAction("A_ScreamAndUnblock");
				}

				if (extra.DeathHeight == 0)
				{
					extra.DeathHeight = ((AActor*)(type->Defaults))->Height;
				}
				type->DeathHeight = extra.DeathHeight;
			}
			bag.statedef.SetStateLabel("Death", &type->OwnedStates[extra.DeathStart]);
		}

		// Burn states are the same as death states, except they can optionally terminate
		if (extra.FireDeathEnd != 0)
		{
			for (i = extra.FireDeathStart; i < extra.FireDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			if (extra.bBurnAway)
			{
				type->OwnedStates[i].NextState = NULL;
			}
			else
			{
				type->OwnedStates[i].Tics = -1;
				type->OwnedStates[i].TicRange = 0;
				type->OwnedStates[i].Misc1 = 0;
			}

			// The first frame plays the burn sound and
			// the second frame makes it nonsolid.
			type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveSound");
			if (extra.bSolidOnBurn)
			{
			}
			else if (extra.FireDeathStart + 1 < extra.FireDeathEnd)
			{
				type->OwnedStates[extra.FireDeathStart+1].SetAction("A_NoBlocking");
			}
			else
			{
				type->OwnedStates[extra.FireDeathStart].SetAction("A_ActiveAndUnblock");
			}

			if (extra.BurnHeight == 0) extra.BurnHeight = ((AActor*)(type->Defaults))->Height;
			type->BurnHeight = extra.BurnHeight;

			bag.statedef.SetStateLabel("Burn", &type->OwnedStates[extra.FireDeathStart]);
		}

		// Ice states are similar to burn and death, except their final frame enters
		// a loop that eventually causes them to bust to pieces.
		if (extra.IceDeathEnd != 0)
		{
			for (i = extra.IceDeathStart; i < extra.IceDeathEnd-1; ++i)
			{
				type->OwnedStates[i].NextState = &type->OwnedStates[i+1];
			}
			type->OwnedStates[i].NextState = &type->OwnedStates[type->NumOwnedStates-1];
			type->OwnedStates[i].Tics = 5;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeath");

			i = type->NumOwnedStates - 1;
			type->OwnedStates[i].NextState = &type->OwnedStates[i];
			type->OwnedStates[i].Tics = 1;
			type->OwnedStates[i].TicRange = 0;
			type->OwnedStates[i].Misc1 = 0;
			type->OwnedStates[i].SetAction("A_FreezeDeathChunks");
			bag.statedef.SetStateLabel("Ice", &type->OwnedStates[extra.IceDeathStart]);
		}
		else if (extra.bGenericIceDeath)
		{
			bag.statedef.SetStateLabel("Ice", RUNTIME_CLASS(AActor)->FindState(NAME_GenericFreezeDeath));
		}
	}
	if (def == DEF_BreakableDecoration)
	{
		((AActor *)(type->Defaults))->flags |= MF_SHOOTABLE;
	}
	if (def == DEF_Projectile)
	{
		((AActor *)(type->Defaults))->flags |= MF_DROPOFF|MF_MISSILE;
	}
	bag.statedef.SetStateLabel("Spawn", &type->OwnedStates[extra.SpawnStart]);
	bag.statedef.InstallStates (type, ((AActor *)(type->Defaults)));
}